

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLcode Curl_alpn_set_negotiated(Curl_cfilter *cf,Curl_easy *data,uchar *proto,size_t proto_len)

{
  connectdata *pcVar1;
  curl_trc_feat *pcVar2;
  long lVar3;
  bool bVar4;
  
  pcVar1 = cf->conn;
  if (((ulong)pcVar1->bits & 8) != 0) {
    lVar3 = 0x581;
    if ((~cf->cft->flags & 10U) == 0) goto LAB_0016dbd0;
  }
  lVar3 = 0x580;
LAB_0016dbd0:
  bVar4 = proto_len == 0 || proto == (uchar *)0x0;
  if (bVar4) {
    *(undefined1 *)((long)&(pcVar1->cpool_node)._list + lVar3) = 0;
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      Curl_infof(data,"ALPN: server did not agree on a protocol. Uses default.");
    }
  }
  else if ((proto_len == 8) && (*(long *)proto == 0x312e312f70747468)) {
    *(undefined1 *)((long)&(pcVar1->cpool_node)._list + lVar3) = 2;
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      Curl_infof(data,"ALPN: server accepted %.*s",8,proto,0x312e312f70747468,bVar4,proto);
    }
  }
  else {
    *(undefined1 *)((long)&(pcVar1->cpool_node)._list + lVar3) = 0;
    Curl_failf(data,"unsupported ALPN protocol: \'%.*s\'",proto_len & 0xffffffff,proto);
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_alpn_set_negotiated(struct Curl_cfilter *cf,
                                  struct Curl_easy *data,
                                  const unsigned char *proto,
                                  size_t proto_len)
{
  unsigned char *palpn =
#ifndef CURL_DISABLE_PROXY
    (cf->conn->bits.tunnel_proxy && Curl_ssl_cf_is_proxy(cf))?
    &cf->conn->proxy_alpn : &cf->conn->alpn
#else
    &cf->conn->alpn
#endif
    ;

  if(proto && proto_len) {
    if(proto_len == ALPN_HTTP_1_1_LENGTH &&
       !memcmp(ALPN_HTTP_1_1, proto, ALPN_HTTP_1_1_LENGTH)) {
      *palpn = CURL_HTTP_VERSION_1_1;
    }
#ifdef USE_HTTP2
    else if(proto_len == ALPN_H2_LENGTH &&
            !memcmp(ALPN_H2, proto, ALPN_H2_LENGTH)) {
      *palpn = CURL_HTTP_VERSION_2;
    }
#endif
#ifdef USE_HTTP3
    else if(proto_len == ALPN_H3_LENGTH &&
            !memcmp(ALPN_H3, proto, ALPN_H3_LENGTH)) {
      *palpn = CURL_HTTP_VERSION_3;
    }
#endif
    else {
      *palpn = CURL_HTTP_VERSION_NONE;
      failf(data, "unsupported ALPN protocol: '%.*s'", (int)proto_len, proto);
      /* TODO: do we want to fail this? Previous code just ignored it and
       * some vtls backends even ignore the return code of this function. */
      /* return CURLE_NOT_BUILT_IN; */
      goto out;
    }
    infof(data, VTLS_INFOF_ALPN_ACCEPTED_LEN_1STR, (int)proto_len, proto);
  }
  else {
    *palpn = CURL_HTTP_VERSION_NONE;
    infof(data, VTLS_INFOF_NO_ALPN);
  }

out:
  return CURLE_OK;
}